

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snr.cc
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  char *__s;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  string *input_stream;
  long lVar10;
  int iVar11;
  char *__s_00;
  double dVar12;
  int frame_length;
  vector<double,_std::allocator<double>_> signal_plus_noise;
  vector<double,_std::allocator<double>_> signal;
  int tmp;
  ifstream ifs1;
  ifstream ifs2;
  int local_62c;
  string local_628;
  undefined1 local_608 [24];
  double local_5f0;
  vector<double,_std::allocator<double>_> local_5e8;
  vector<double,_std::allocator<double>_> local_5d0;
  string local_5b8 [3];
  ios_base local_548 [264];
  string local_440;
  byte abStack_420 [80];
  ios_base local_3d0 [408];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_62c = 0x100;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_608._0_8_;
  local_608._0_16_ = auVar3 << 0x40;
LAB_001026c5:
  iVar7 = ya_getopt_long(argc,argv,"l:o:h",(option *)0x0,(int *)0x0);
  if (iVar7 == 0x6c) goto code_r0x001026dc;
  if (iVar7 == -1) {
    if (argc - ya_optind == 1) {
      lVar10 = (long)argc + -1;
      __s_00 = (char *)0x0;
    }
    else {
      if (argc - ya_optind != 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_440,"Just two input files, file1 and infile, are required",0x34
                  );
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"snr","");
        sptk::PrintErrorMessage(&local_238,(ostringstream *)&local_440);
        goto LAB_00102983;
      }
      lVar10 = (long)argc + -2;
      __s_00 = argv[(long)argc + -1];
    }
    __s = argv[lVar10];
    std::ifstream::ifstream(&local_440);
    std::ifstream::open((char *)&local_440,(_Ios_Openmode)__s);
    auVar3 = local_608._0_16_;
    if ((abStack_420[*(long *)(local_440._M_dataplus._M_p + -0x18)] & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Cannot open file ",0x11);
      if (__s == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffff9c8 +
                        (int)*(undefined8 *)(local_238._M_dataplus._M_p + -0x18) + 0x400);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,__s,sVar8);
      }
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"snr","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
        operator_delete(local_5b8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar7 = 1;
      goto LAB_00103173;
    }
    input_stream = &local_238;
    std::ifstream::ifstream(input_stream);
    if ((__s_00 != (char *)0x0) &&
       (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s_00),
       (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b8,"Cannot open file ",0x11);
      sVar8 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,__s_00,sVar8);
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
      sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
      goto LAB_00103131;
    }
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 == '\0') {
      input_stream = (string *)&std::cin;
    }
    if (auVar3._0_4_ == 0) {
      local_608._0_16_ = ZEXT816(0);
      while ((bVar5 = sptk::ReadStream<double>((double *)&local_5d0,(istream *)&local_440), bVar5 &&
             (bVar5 = sptk::ReadStream<double>((double *)&local_5e8,(istream *)input_stream), bVar5)
             )) {
        dVar12 = (double)local_608._8_8_ +
                 ((double)local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start -
                 (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) *
                 ((double)local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start -
                 (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
        local_608._8_4_ = SUB84(dVar12,0);
        local_608._0_8_ =
             (double)local_608._0_8_ +
             (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start *
             (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_608._12_4_ = (int)((ulong)dVar12 >> 0x20);
      }
      if (((double)local_608._0_8_ != 0.0) || (NAN((double)local_608._0_8_))) {
        if (((double)local_608._8_8_ == 0.0) && (!NAN((double)local_608._8_8_))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,"The noise power is 0.0",0x16);
          local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
          sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
          goto LAB_00103131;
        }
        dVar12 = log10((double)local_608._0_8_ / (double)local_608._8_8_);
        bVar5 = sptk::WriteStream<double>(dVar12 * 10.0,(ostream *)&std::cout);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,"Failed to write SNR",0x13);
          local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
          sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
          goto LAB_00103131;
        }
        goto LAB_001030b0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b8,"The signal power is 0.0",0x17);
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
      sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
LAB_00103131:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      std::ios_base::~ios_base(local_548);
      iVar7 = 1;
      goto LAB_00103166;
    }
    if (2 < auVar3._0_4_) goto LAB_001030b0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_5d0,(long)local_62c,(allocator_type *)local_5b8);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_5e8,(long)local_62c,(allocator_type *)local_5b8);
    iVar11 = 0;
    local_5f0 = 0.0;
    goto LAB_00102b9b;
  }
  if (iVar7 == 0x68) {
    anon_unknown.dwarf_3010::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (iVar7 != 0x6f) {
    anon_unknown.dwarf_3010::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  std::__cxx11::string::string((string *)&local_440,ya_optarg,(allocator *)&local_238);
  bVar5 = sptk::ConvertStringToInteger(&local_440,(int *)local_5b8);
  if (bVar5) {
    bVar5 = sptk::IsInRange((int)local_5b8[0]._M_dataplus._M_p,0,2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p);
    }
    if (bVar5) {
      local_608._0_8_ = (ulong)local_5b8[0]._M_dataplus._M_p & 0xffffffff;
      goto LAB_001026c5;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_440,"The argument for the -o option must be an integer ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"in the range of ",0x10);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_440,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
  std::ostream::operator<<((ostream *)poVar9,2);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"snr","");
  sptk::PrintErrorMessage(&local_238,(ostringstream *)&local_440);
  goto LAB_00102983;
code_r0x001026dc:
  std::__cxx11::string::string((string *)&local_440,ya_optarg,(allocator *)&local_238);
  bVar4 = sptk::ConvertStringToInteger(&local_440,&local_62c);
  bVar5 = local_62c < 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  if (!bVar4 || bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_440,"The argument for the -l option must be a positive integer",
               0x39);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"snr","");
    sptk::PrintErrorMessage(&local_238,(ostringstream *)&local_440);
LAB_00102983:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
    std::ios_base::~ios_base(local_3d0);
    return 1;
  }
  goto LAB_001026c5;
LAB_00102b9b:
  bVar5 = sptk::ReadStream<double>(false,0,0,local_62c,&local_5d0,(istream *)&local_440,(int *)0x0);
  if ((!bVar5) ||
     (bVar5 = sptk::ReadStream<double>
                        (false,0,0,local_62c,&local_5e8,(istream *)input_stream,(int *)0x0), !bVar5)
     ) {
    bVar5 = true;
    iVar7 = 0;
    if ((iVar11 != 0 && local_608._0_4_ == 1) &&
       (bVar4 = sptk::WriteStream<double>(local_5f0 / (double)iVar11,(ostream *)&std::cout),
       iVar7 = 0, !bVar4)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b8,"Failed to write segmental SNR",0x1d);
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
      sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
LAB_00103052:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      std::ios_base::~ios_base(local_548);
      bVar5 = false;
      iVar7 = 1;
    }
    if (local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (bVar5) {
LAB_001030b0:
      iVar7 = 0;
    }
LAB_00103166:
    std::ifstream::~ifstream(&local_238);
LAB_00103173:
    std::ifstream::~ifstream(&local_440);
    return iVar7;
  }
  if ((long)local_62c < 1) {
LAB_00102f56:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"The signal power of ",0x14);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_5b8,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"th frame is 0.0",0xf);
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
    sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
    goto LAB_00103052;
  }
  dVar12 = 0.0;
  dVar2 = 0.0;
  lVar10 = 0;
  do {
    dVar1 = local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10];
    dVar12 = dVar12 + (local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10] - dVar1) *
                      (local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10] - dVar1);
    dVar2 = dVar2 + dVar1 * dVar1;
    lVar10 = lVar10 + 1;
  } while (local_62c != lVar10);
  if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_00102f56;
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"The noise power of ",0x13);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_5b8,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"th frame is 0.0",0xf);
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
    sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
    goto LAB_00103052;
  }
  dVar12 = log10(dVar2 / dVar12);
  if (local_608._0_4_ == 1) {
    local_5f0 = local_5f0 + dVar12 * 10.0;
  }
  else if ((local_608._0_4_ == 2) &&
          (bVar5 = sptk::WriteStream<double>(dVar12 * 10.0,(ostream *)&std::cout), !bVar5)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Failed to write segmental SNR of ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_5b8,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"th frame",8);
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
    sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
    goto LAB_00103052;
  }
  iVar11 = iVar11 + 1;
  goto LAB_00102b9b;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_length(kDefaultFrameLength);
  OutputType output_type(kDefaultOutputType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_length) ||
            frame_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(OutputType::kNumOutputTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        output_type = static_cast<OutputType>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* signal_file;
  const char* signal_plus_noise_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    signal_file = argv[argc - 2];
    signal_plus_noise_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    signal_file = argv[argc - 1];
    signal_plus_noise_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }

  // Open stream for reading signal sequence.
  std::ifstream ifs1;
  ifs1.open(signal_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << signal_file;
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }
  std::istream& stream_for_signal(ifs1);

  // Open stream for reading signal plus noise sequence.
  std::ifstream ifs2;
  if (NULL != signal_plus_noise_file) {
    ifs2.open(signal_plus_noise_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << signal_plus_noise_file;
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  }
  std::istream& stream_for_signal_plus_noise(ifs2.is_open() ? ifs2 : std::cin);

  if (OutputType::kSnr == output_type) {
    double signal;
    double signal_plus_noise;
    double signal_power(0.0);
    double noise_power(0.0);
    while (
        sptk::ReadStream(&signal, &stream_for_signal) &&
        sptk::ReadStream(&signal_plus_noise, &stream_for_signal_plus_noise)) {
      signal_power += signal * signal;

      const double noise(signal_plus_noise - signal);
      noise_power += noise * noise;
    }

    if (0.0 == signal_power) {
      std::ostringstream error_message;
      error_message << "The signal power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
    if (0.0 == noise_power) {
      std::ostringstream error_message;
      error_message << "The noise power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }

    const double snr(10.0 * std::log10(signal_power / noise_power));
    if (!sptk::WriteStream(snr, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write SNR";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  } else if (OutputType::kSegmentalSnr == output_type ||
             OutputType::kSegmentalSnrPerFrame == output_type) {
    std::vector<double> signal(frame_length);
    std::vector<double> signal_plus_noise(frame_length);
    double segmental_snr(0.0);
    int frame_index(0);
    for (; sptk::ReadStream(false, 0, 0, frame_length, &signal,
                            &stream_for_signal, NULL) &&
           sptk::ReadStream(false, 0, 0, frame_length, &signal_plus_noise,
                            &stream_for_signal_plus_noise, NULL);
         ++frame_index) {
      double segmental_signal_power(0.0);
      double segmental_noise_power(0.0);

      for (int i(0); i < frame_length; ++i) {
        segmental_signal_power += signal[i] * signal[i];

        const double noise(signal_plus_noise[i] - signal[i]);
        segmental_noise_power += noise * noise;
      }
      if (0.0 == segmental_signal_power) {
        std::ostringstream error_message;
        error_message << "The signal power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
      if (0.0 == segmental_noise_power) {
        std::ostringstream error_message;
        error_message << "The noise power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }

      const double segmental_snr_of_current_frame(
          10.0 * std::log10(segmental_signal_power / segmental_noise_power));
      if (OutputType::kSegmentalSnr == output_type) {
        segmental_snr += segmental_snr_of_current_frame;
      } else if (OutputType::kSegmentalSnrPerFrame == output_type) {
        if (!sptk::WriteStream(segmental_snr_of_current_frame, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write segmental SNR of " << frame_index
                        << "th frame";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
      }
    }

    if (OutputType::kSegmentalSnr == output_type && 0 < frame_index) {
      segmental_snr /= frame_index;
      if (!sptk::WriteStream(segmental_snr, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write segmental SNR";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
    }
  }

  return 0;
}